

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

bool __thiscall
glcts::ViewportArray::DrawTestBase::checkResults
          (DrawTestBase *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  bool bVar1;
  int iVar2;
  uint y;
  GLuint x;
  GLuint x_00;
  bool bVar3;
  vector<int,_std::allocator<int>_> texture_data;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (GLint *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,0x4000);
  Utils::texture::get(texture_0,0x8d94,0x1404,
                      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  bVar3 = false;
  y = 0;
  iVar2 = 0;
  do {
    x_00 = 0;
    do {
      bVar1 = checkRegionR32I(this,x_00,y,0x20,0x20,iVar2 + x_00,
                              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      if (!bVar1) goto LAB_00dcfd72;
      x_00 = x_00 + 1;
    } while (x_00 != 4);
    bVar3 = 2 < y;
    y = y + 1;
    iVar2 = iVar2 + 4;
  } while (y != 4);
  bVar3 = true;
LAB_00dcfd72:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLint *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool DrawTestBase::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	bool  check_result = true;
	GLint index		   = 0;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			bool result = checkRegionR32I(x, y, index, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}

			index += 1;
		}
	}

end:
	return check_result;
}